

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O1

KeyData * __thiscall
cfd::core::KeyData::DerivePubkey
          (KeyData *__return_storage_ptr__,KeyData *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *path,bool has_rebase_path)

{
  Privkey *this_00;
  Pubkey *this_01;
  bool bVar1;
  CfdException *this_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> join_path;
  ByteData fp;
  ExtPubkey key;
  Privkey local_e8;
  Pubkey local_c8;
  undefined1 local_b0 [40];
  pointer local_88;
  pointer local_70;
  pointer local_58;
  Pubkey local_40;
  
  this_00 = &(this->extprivkey_).privkey_;
  bVar1 = Privkey::IsValid(this_00);
  if (bVar1) {
    ExtPrivkey::DerivePubkey((ExtPubkey *)local_b0,&this->extprivkey_,path);
    if (has_rebase_path) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
      local_e8.is_compressed_ = (this->extprivkey_).privkey_.is_compressed_;
      local_e8._25_3_ = *(undefined3 *)&(this->extprivkey_).privkey_.field_0x19;
      local_e8.net_type_ = (this->extprivkey_).privkey_.net_type_;
      Privkey::GeneratePubkey(&local_40,&local_e8,true);
      Pubkey::GetFingerprint(&local_c8.data_,&local_40,4);
      if (local_40.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_40.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      KeyData(__return_storage_ptr__,(ExtPubkey *)local_b0,path,&local_c8.data_);
    }
    else {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8,&this->path_);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8,
                 ((long)(path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 2) +
                 ((long)local_e8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_e8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2));
      ::std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_int*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8);
      KeyData(__return_storage_ptr__,(ExtPubkey *)local_b0,
              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8,&this->fingerprint_);
      local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start =
           local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
  }
  else {
    this_01 = &(this->extpubkey_).pubkey_;
    bVar1 = Pubkey::IsValid(this_01);
    if (!bVar1) {
      local_b0._0_8_ = "cfdcore_hdwallet.cpp";
      local_b0._8_4_ = 0x54a;
      local_b0._16_8_ = (long)"KeyData::DerivePubkey" + 9;
      logger::log<>((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,"Failed to invalid extPubkey."
                   );
      this_02 = (CfdException *)__cxa_allocate_exception(0x30);
      local_b0._0_8_ = local_b0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,"Failed to invalid extPubkey.","");
      CfdException::CfdException(this_02,kCfdIllegalStateError,(string *)local_b0);
      __cxa_throw(this_02,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ExtPubkey::DerivePubkey((ExtPubkey *)local_b0,&this->extpubkey_,path);
    if (has_rebase_path) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01);
      Pubkey::GetFingerprint(&local_e8.data_,&local_c8,4);
      if (local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      KeyData(__return_storage_ptr__,(ExtPubkey *)local_b0,path,&local_e8.data_);
      local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start =
           local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8,&this->path_);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8,
                 ((long)(path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 2) +
                 ((long)local_e8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_e8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2));
      ::std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_int*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8);
      KeyData(__return_storage_ptr__,(ExtPubkey *)local_b0,
              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8,&this->fingerprint_);
      local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start =
           local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
  }
  if (local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58 != (pointer)0x0) {
    operator_delete(local_58);
  }
  if (local_70 != (pointer)0x0) {
    operator_delete(local_70);
  }
  if (local_88 != (pointer)0x0) {
    operator_delete(local_88);
  }
  if ((pointer)local_b0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_b0._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

KeyData KeyData::DerivePubkey(
    std::vector<uint32_t> path, bool has_rebase_path) const {
  if (extprivkey_.IsValid()) {
    auto key = extprivkey_.DerivePubkey(path);
    if (has_rebase_path) {
      auto fp = extprivkey_.GetPrivkey().GeneratePubkey().GetFingerprint();
      return KeyData(key, path, fp);
    } else {
      auto join_path = path_;
      join_path.reserve(join_path.size() + path.size());
      std::copy(path.begin(), path.end(), std::back_inserter(join_path));
      return KeyData(key, join_path, fingerprint_);
    }
  } else if (extpubkey_.IsValid()) {
    auto key = extpubkey_.DerivePubkey(path);
    if (has_rebase_path) {
      auto fp = extpubkey_.GetPubkey().GetFingerprint();
      return KeyData(key, path, fp);
    } else {
      auto join_path = path_;
      join_path.reserve(join_path.size() + path.size());
      std::copy(path.begin(), path.end(), std::back_inserter(join_path));
      return KeyData(key, join_path, fingerprint_);
    }
  } else {
    warn(CFD_LOG_SOURCE, "Failed to invalid extPubkey.");
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Failed to invalid extPubkey.");
  }
}